

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
dlib::
add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>
::update_parameters<dlib::sgd>
          (add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>
           *this,sstack<dlib::sgd> solvers,double learning_rate)

{
  uint *puVar1;
  double dVar2;
  add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>
  *this_00;
  sgd *this_01;
  tensor *src2;
  ostream *poVar3;
  fatal_error *this_02;
  sstack<dlib::sgd> solvers_00;
  sstack<dlib::sgd> solvers_local;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  solvers_local.mysize = solvers.mysize;
  solvers_local.data = solvers.data;
  if (0x4f < solvers_local.mysize) {
    if (((this->params_grad).super_tensor.m_size != 0) &&
       ((dVar2 = (this->details).learning_rate_multiplier, dVar2 != 0.0 || (NAN(dVar2))))) {
      this_01 = sstack<dlib::sgd>::top(&solvers_local);
      src2 = sgd::operator()(this_01,(float)learning_rate,&this->details,
                             &(this->params_grad).super_tensor);
      tt::add((tensor *)this,(tensor *)this,src2);
    }
    this_00 = (this->subnetwork)._M_t.super___uniq_ptr_impl<_919b900a_>._M_t.
              super__Tuple_impl<_1defd231_>.
              super__Head_base<0UL,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>_*,_false>
              ._M_head_impl;
    solvers_00 = sstack<dlib::sgd>::pop(&solvers_local,1);
    add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>
    ::update_parameters<dlib::sgd>(this_00,solvers_00,learning_rate);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3ed);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 3, 3, 2, 2>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::repeat<3, resnet::def<dlib::bn_con>::resbottleneck_128, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::add_prev_<dlib::tag2>, dlib::add_layer<dlib::avg_pool_<2, 2, 2, 2>, dlib::add_skip_layer<dlib::tag1, dlib::add_tag_layer<2, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<512, 1, 1, 1, 1>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<128, 3, 3, 2, 2>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<128, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::repeat<3, resnet::def<dlib::bn_con>::resbottleneck_64, dlib::add_layer<dlib::max_pool_<3, 3, 2, 2>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<64, 7, 7, 2, 2>, dlib::input_rgb_image>>>>>>>>>>>>>>>>>>>>>>>>>>::update_parameters(sstack<solver_type>, double) [LAYER_DETAILS = dlib::bn_<dlib::CONV_MODE>, SUBNET = dlib::add_layer<dlib::con_<256, 3, 3, 2, 2>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::repeat<3, resnet::def<dlib::bn_con>::resbottleneck_128, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::add_prev_<dlib::tag2>, dlib::add_layer<dlib::avg_pool_<2, 2, 2, 2>, dlib::add_skip_layer<dlib::tag1, dlib::add_tag_layer<2, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<512, 1, 1, 1, 1>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<128, 3, 3, 2, 2>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<128, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::repeat<3, resnet::def<dlib::bn_con>::resbottleneck_64, dlib::add_layer<dlib::m..." /* TRUNCATED STRING LITERAL */
                          );
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,"solvers.size()>=num_computational_layers");
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar3,"\n");
  this_02 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_02,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_02,&fatal_error::typeinfo,error::~error);
}

Assistant:

void update_parameters(sstack<solver_type> solvers, double learning_rate)
        {
            DLIB_CASSERT(solvers.size()>=num_computational_layers);
            // Don't try to adjust the parameters if this layer doesn't have any or the
            // learning rate is disabled for this layer.
            if (params_grad.size() != 0 && get_learning_rate_multiplier(details) != 0)
            {
                const tensor& step = solvers.top()(learning_rate, details, static_cast<const tensor&>(params_grad));
                tt::add(details.get_layer_params(), details.get_layer_params(), step);
            }
            subnetwork->update_parameters(solvers.pop(), learning_rate);
        }